

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::processHexWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  iVar2 = (int)word->_M_string_length;
  if (iVar2 < 3) {
    pcVar5 = (word->_M_dataplus)._M_p;
    iVar1 = isxdigit((int)*pcVar5);
    if ((iVar1 != 0) && ((iVar2 != 2 || (iVar2 = isxdigit((int)pcVar5[1]), iVar2 != 0)))) {
      lVar4 = strtol(pcVar5,(char **)0x0,0x10);
      std::operator<<(out,(char)lVar4);
      return 1;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
    poVar3 = std::operator<<(poVar3," at token: ");
    poVar3 = std::operator<<(poVar3,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar5 = "Invalid character in hexadecimal number.";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
    poVar3 = std::operator<<(poVar3," at token: ");
    poVar3 = std::operator<<(poVar3,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar5 = "Size of hexadecimal number is too large.  Max is ff.";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int Binasc::processHexWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();
	uchar outputByte;

	if (length > 2) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "Size of hexadecimal number is too large.  Max is ff." << std::endl;
		return 0;
	}

	if (!isxdigit(word[0]) || (length == 2 && !isxdigit(word[1]))) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "Invalid character in hexadecimal number." << std::endl;
		return 0;
	}

	outputByte = (uchar)strtol(word.c_str(), (char**)NULL, 16);
	out << outputByte;
	return 1;
}